

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels(NeuralNetworkClassifier *this)

{
  if (((this->_oneof_case_[0] == 0x65) || (this->_oneof_case_[0] == 100)) &&
     ((this->ClassLabels_).stringclasslabels_ != (StringVector *)0x0)) {
    (*(((this->ClassLabels_).stringclasslabels_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void NeuralNetworkClassifier::clear_ClassLabels() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.NeuralNetworkClassifier)
  switch (ClassLabels_case()) {
    case kStringClassLabels: {
      delete ClassLabels_.stringclasslabels_;
      break;
    }
    case kInt64ClassLabels: {
      delete ClassLabels_.int64classlabels_;
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = CLASSLABELS_NOT_SET;
}